

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O2

ostream * operator<<(ostream *os,solution *sol)

{
  _Elt_pointer psVar1;
  ostream *poVar2;
  _Elt_pointer psVar3;
  step *s;
  _Elt_pointer s_00;
  _Map_pointer local_40;
  
  if (sol->not_found_reason == (char *)0x0) {
    poVar2 = std::operator<<(os,"For measuring ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,sol->measure);
    std::operator<<(poVar2," :\n");
    s_00 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
    psVar3 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    local_40 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    psVar1 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    while (s_00 != psVar1) {
      poVar2 = std::operator<<(os,"  ");
      poVar2 = operator<<(poVar2,s_00);
      std::operator<<(poVar2,'\n');
      s_00 = s_00 + 1;
      if (s_00 == psVar3) {
        s_00 = local_40[1];
        local_40 = local_40 + 1;
        psVar3 = s_00 + 9;
      }
    }
    poVar2 = std::operator<<(os,"  Wasted water: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\n');
  }
  else {
    poVar2 = std::operator<<(os,"No solution found for measurement ");
    std::ostream::operator<<((ostream *)poVar2,sol->measure);
    poVar2 = std::operator<<(os," : ");
    std::operator<<(poVar2,sol->not_found_reason);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const solution& sol)
{
	if (sol.not_found_reason) {
		os << "No solution found for measurement " << sol.measure;
		os << " : " << sol.not_found_reason;
	}
	else {
		os << "For measuring " << sol.measure << " :\n";
		for (auto&& s : sol.current_steps) {
			os << "  " << s << '\n';
		}
		os << "  Wasted water: " << sol.wastage << '\n';
	}
	return os;
}